

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O1

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::operator==
          (Dynamic_Object_Constructor *this,Proxy_Function_Base *f)

{
  pointer __n;
  undefined1 uVar1;
  int iVar2;
  
  if (((f->_vptr_Proxy_Function_Base == (_func_int **)&PTR__Dynamic_Object_Constructor_003d83c0) &&
      (__n = f[1].m_types.
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_start,
      __n == (pointer)(this->m_type_name)._M_string_length)) &&
     ((__n == (pointer)0x0 ||
      (iVar2 = bcmp(f[1]._vptr_Proxy_Function_Base,(this->m_type_name)._M_dataplus._M_p,(size_t)__n)
      , iVar2 == 0)))) {
    uVar1 = (**(code **)(**(long **)&f[1].m_arity + 0x10))
                      (*(long **)&f[1].m_arity,
                       (this->m_func).
                       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool operator==(const Proxy_Function_Base &f) const noexcept override {
          const Dynamic_Object_Constructor *dc = dynamic_cast<const Dynamic_Object_Constructor *>(&f);
          return (dc != nullptr) && dc->m_type_name == m_type_name && (*dc->m_func) == (*m_func);
        }